

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O3

int __thiscall CmdOpts::parse(CmdOpts *this)

{
  ArgHas AVar1;
  char **ppcVar2;
  string *psVar3;
  char *pcVar4;
  char ****ppppcVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char ******ppppppcVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  Option *pOVar14;
  char ******ppppppcVar15;
  char acStack_50 [8];
  char *****local_48;
  char ****local_40;
  uint local_34;
  
  iVar6 = this->_numOpts;
  lVar8 = (ulong)(iVar6 + 1) * -0x20;
  ppppppcVar15 = &local_48 + (ulong)(iVar6 + 1) * -4;
  pcVar12 = (char *)((long)ppppppcVar15 - ((ulong)(iVar6 * 3 + 1) + 0xf & 0xfffffffffffffff0));
  local_34 = 0;
  pcVar7 = pcVar12;
  local_40 = (char ****)pcVar12;
  if (0 < iVar6) {
    do {
      pOVar14 = this->_opts;
      *pOVar14[(int)local_34].present = false;
      *pcVar7 = pOVar14[(int)local_34].letter;
      pOVar14 = this->_opts;
      lVar9 = (long)(int)local_34;
      ppppppcVar10 = ppppppcVar15 + lVar9 * 4 + 1;
      ppppppcVar15[lVar9 * 4] = (char *****)pOVar14[lVar9].name;
      AVar1 = pOVar14[lVar9].arg.has;
      if (AVar1 == ArgOptional) {
        *(undefined4 *)ppppppcVar10 = 2;
        pcVar7[1] = ':';
        pcVar7[2] = ':';
        pcVar7 = pcVar7 + 3;
      }
      else if (AVar1 == ArgRequired) {
        *(undefined4 *)ppppppcVar10 = 1;
        pcVar7[1] = ':';
        pcVar7 = pcVar7 + 2;
      }
      else {
        pcVar7 = pcVar7 + 1;
        *(undefined4 *)ppppppcVar10 = 0;
      }
      uVar11 = local_34 + 1;
      *(undefined8 *)(&stack0xffffffffffffffc8 + (long)(int)local_34 * 0x20 + lVar8) = 0;
      *(undefined4 *)(&stack0xffffffffffffffd0 + (long)(int)local_34 * 0x20 + lVar8) = 0;
      iVar6 = this->_numOpts;
      local_34 = uVar11;
    } while ((int)uVar11 < iVar6);
  }
  *(undefined8 *)(&stack0xffffffffffffffc8 + (long)iVar6 * 0x20 + lVar8) = 0;
  *(undefined8 *)((long)(&stack0xffffffffffffffc8 + (long)iVar6 * 0x20 + lVar8) + 8) = 0;
  ppppppcVar15[(long)iVar6 * 4] = (char *****)0x0;
  (ppppppcVar15 + (long)iVar6 * 4)[1] = (char *****)0x0;
  *pcVar7 = '\0';
  local_34 = 0;
  local_48 = (char *****)ppppppcVar15;
  do {
    ppppcVar5 = local_40;
    iVar6 = this->_argc;
    ppcVar2 = this->_argv;
    pcVar12[-8] = -0x14;
    pcVar12[-7] = -0xc;
    pcVar12[-6] = '\x10';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    iVar6 = getopt_long(iVar6,ppcVar2,ppppcVar5,ppppppcVar15,&local_34);
    if (iVar6 == 0) {
      uVar11 = this->_numOpts;
    }
    else {
      if (iVar6 == -1) {
        return _optind;
      }
      if (iVar6 == 0x3f) {
        return -1;
      }
      uVar11 = this->_numOpts;
      if ((int)uVar11 < 1) {
        uVar13 = 0;
      }
      else {
        pOVar14 = this->_opts;
        uVar13 = 0;
        do {
          if (pOVar14->letter == (char)iVar6) goto LAB_0010f52d;
          uVar13 = uVar13 + 1;
          pOVar14 = pOVar14 + 1;
        } while (uVar11 != uVar13);
        uVar13 = (ulong)uVar11;
      }
LAB_0010f52d:
      local_34 = (uint)uVar13;
    }
    if (((int)local_34 < 0) || ((int)uVar11 <= (int)local_34)) {
      *(code **)(pcVar12 + -8) = find;
      __assert_fail("optIdx >= 0 && optIdx < _numOpts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/CmdOpts.cpp"
                    ,0x81,"int CmdOpts::parse()");
    }
    pOVar14 = this->_opts;
    uVar13 = (ulong)local_34;
    *pOVar14[uVar13].present = true;
    pcVar7 = _optarg;
    if (_optarg != (char *)0x0 && pOVar14[uVar13].arg.has != ArgNone) {
      if (pOVar14[uVar13].arg.type == ArgInt) {
        pcVar12[-8] = -0x3c;
        pcVar12[-7] = -0xb;
        pcVar12[-6] = '\x10';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        lVar8 = strtol(_optarg,(char **)0x0,0);
        *this->_opts[(int)local_34].arg.value.intPtr = (int)lVar8;
      }
      else {
        psVar3 = pOVar14[uVar13].arg.value.strPtr;
        pcVar4 = (char *)psVar3->_M_string_length;
        pcVar12[-8] = -0x6e;
        pcVar12[-7] = -0xb;
        pcVar12[-6] = '\x10';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        strlen(_optarg);
        ppppppcVar15 = (char ******)local_48;
        pcVar12[-8] = -0x4d;
        pcVar12[-7] = -0xb;
        pcVar12[-6] = '\x10';
        pcVar12[-5] = '\0';
        pcVar12[-4] = '\0';
        pcVar12[-3] = '\0';
        pcVar12[-2] = '\0';
        pcVar12[-1] = '\0';
        std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar4,(ulong)pcVar7);
      }
    }
  } while( true );
}

Assistant:

int
CmdOpts::parse()
{
    struct option long_opts[_numOpts + 1];
    char optstring[_numOpts * 3 + 1];
    char* optPtr = optstring;
    int optIdx;
    int rc;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
    {
        *_opts[optIdx].present = false;

        *optPtr++ = _opts[optIdx].letter;
        long_opts[optIdx].name = _opts[optIdx].name;
        switch (_opts[optIdx].arg.has)
        {
        default:
        case ArgNone:
            long_opts[optIdx].has_arg = no_argument;
            break;
        case ArgOptional:
            long_opts[optIdx].has_arg = optional_argument;
            *optPtr++ = ':';
            *optPtr++ = ':';
            break;
        case ArgRequired:
            long_opts[optIdx].has_arg = required_argument;
            *optPtr++ = ':';
            break;
        }
        long_opts[optIdx].flag = NULL;
        long_opts[optIdx].val = 0;
    }

    memset(&long_opts[_numOpts], 0, sizeof(long_opts[_numOpts]));
    *optPtr = '\0';
    optIdx = 0;
    while ((rc = getopt_long(_argc, _argv, optstring, long_opts, &optIdx)) != -1)
    {
        if (rc == '?')
            return -1;

        if (rc != 0)
           optIdx = find(rc);

        assert(optIdx >= 0 && optIdx < _numOpts);
        *_opts[optIdx].present = true;
        if (_opts[optIdx].arg.has != ArgNone && optarg)
        {
            switch (_opts[optIdx].arg.type)
            {
            case ArgInt:
                *_opts[optIdx].arg.value.intPtr = strtol(optarg, NULL, 0);
                break;
            default:
            case ArgString:
                *_opts[optIdx].arg.value.strPtr = optarg;
                break;
            }
        }
    }

    return optind;
}